

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str_size_t mctools_strlen(char *c_str,mcu8str_size_t nmax)

{
  void *pvVar1;
  ulong in_RSI;
  void *in_RDI;
  mcu8str_size_t o_size;
  char *nullchr;
  undefined8 local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  if (in_RSI == 0) {
    local_10 = 0xffffffff;
  }
  if (0x7fffffffffffffff < local_10) {
    mctools_impl_error((char *)0x10268d);
  }
  pvVar1 = memchr(in_RDI,0,local_10);
  if (pvVar1 == (void *)0x0) {
    local_20 = local_10;
  }
  else {
    local_20 = (long)pvVar1 - (long)in_RDI;
  }
  if (0xfffffffd < local_20) {
    mctools_impl_error((char *)0x1026e1);
  }
  return local_20;
}

Assistant:

mcu8str_size_t mctools_strlen( const char * c_str, mcu8str_size_t nmax )
  {
    //safe strlen which guarantees result can fit in an unsigned integer (or
    //less, when 0<nmax<UINT_MAX is provided).
    if ( nmax == 0 )
      nmax = ( UINT_MAX > PTRDIFF_MAX ? PTRDIFF_MAX : UINT_MAX );

    if ( nmax > PTRDIFF_MAX )
      mctools_impl_error("str length out of range");

    const char * nullchr = (const char *) STDNS memchr( c_str, '\0', nmax );
    mcu8str_size_t o_size;
    if ( nullchr )
      o_size = nullchr - c_str;
    else
      o_size = nmax;
    if ( !MCTOOLS_STROKFORUINT(o_size) )
      mctools_impl_error("str length out of range");
    return o_size;
  }